

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O1

void __thiscall
gutil::InvalidArgumentException::InvalidArgumentException
          (InvalidArgumentException *this,string *message)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Invalid argument","");
  Exception::Exception(&this->super_Exception,&local_40,message);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  *(undefined ***)&this->super_Exception = &PTR__Exception_00163948;
  return;
}

Assistant:

InvalidArgumentException(const std::string &message) :
      Exception("Invalid argument", message) { }